

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void testing::internal::
     SharedPayload<testing::internal::EqMatcher<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
     ::Destroy(SharedPayloadBase *shared)

{
  if (shared != (SharedPayloadBase *)0x0) {
    if (*(SharedPayloadBase **)(shared + 2) != shared + 6) {
      operator_delete(*(SharedPayloadBase **)(shared + 2),*(long *)(shared + 6) + 1);
    }
    operator_delete(shared,0x38);
    return;
  }
  return;
}

Assistant:

static void Destroy(SharedPayloadBase* shared) {
    delete static_cast<SharedPayload*>(shared);
  }